

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QVariant * __thiscall QMap<int,_QVariant>::operator[](QMap<int,_QVariant> *this,int *key)

{
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QVariant>_>,_bool> pVar3;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  local_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined8 local_50;
  pair<const_int,_QVariant> local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_70.d.ptr ==
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)local_70.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_70.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
          )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)local_70.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                        *)local_70.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_QVariant>,_std::_Select1st<std::pair<const_int,_QVariant>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_68._16_8_ = 0;
    local_68.shared = (PrivateShared *)0x0;
    local_68._8_8_ = 0;
    local_48.first = *key;
    local_48.second.d.data.shared = (PrivateShared *)0x0;
    local_48.second.d.data._8_8_ = 0;
    local_48.second.d.data._16_8_ = 0;
    local_48.second.d._24_8_ = 2;
    local_50 = 2;
    pVar3 = std::
            _Rb_tree<int,std::pair<int_const,QVariant>,std::_Select1st<std::pair<int_const,QVariant>>,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
            ::_M_insert_unique<std::pair<int_const,QVariant>>
                      ((_Rb_tree<int,std::pair<int_const,QVariant>,std::_Select1st<std::pair<int_const,QVariant>>,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
                        *)&pQVar1->m,&local_48);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    ::QVariant::~QVariant(&local_48.second);
    ::QVariant::~QVariant((QVariant *)&local_68);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QVariant *)&iVar2._M_node[1]._M_parent;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }